

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  long alStack_758 [4];
  undefined1 auStack_738 [216];
  code *pcStack_660;
  long lStack_650;
  long lStack_648;
  long alStack_640 [11];
  undefined1 auStack_5e8 [16];
  long alStack_5d8 [25];
  undefined1 auStack_510 [16];
  long alStack_500 [27];
  code *pcStack_428;
  long lStack_418;
  long lStack_410;
  undefined1 auStack_408 [216];
  code *pcStack_330;
  long lStack_320;
  long lStack_318;
  undefined1 auStack_310 [16];
  long alStack_300 [27];
  code *pcStack_228;
  long lStack_218;
  long lStack_210;
  undefined1 auStack_208 [16];
  long alStack_1f8 [27];
  code *pcStack_120;
  long local_110;
  long local_108;
  undefined8 local_100 [2];
  undefined1 local_f0 [16];
  long local_e0 [27];
  
  pcStack_120 = (code *)0x1c6722;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_f0);
  local_e0[0] = (long)iVar1;
  local_100[0] = 0;
  if (local_e0[0] == 0) {
    pcStack_120 = (code *)0x1c6758;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,local_100);
    local_e0[0] = (long)iVar1;
    local_110 = 0;
    if (local_e0[0] != 0) goto LAB_001c68bc;
    pcStack_120 = (code *)0x1c677d;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1c678a;
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_110 = (long)iVar1;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001c68cb;
    pcStack_120 = (code *)0x1c67bb;
    iVar1 = uv_tcp_bind(local_e0,local_f0,0);
    local_110 = (long)iVar1;
    local_108 = 0;
    if (local_110 != 0) goto LAB_001c68da;
    pcStack_120 = (code *)0x1c67ec;
    iVar1 = uv_tcp_bind(local_e0,local_100,0);
    local_110 = (long)iVar1;
    local_108 = -0x16;
    if (local_110 != -0x16) goto LAB_001c68e9;
    pcStack_120 = (code *)0x1c681d;
    uv_close(local_e0,close_cb);
    pcStack_120 = (code *)0x1c6822;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1c682c;
    uv_run(uVar2,0);
    local_110 = 1;
    local_108 = (long)close_cb_called;
    if (local_108 != 1) goto LAB_001c68f8;
    pcStack_120 = (code *)0x1c6856;
    unaff_RBX = uv_default_loop();
    pcStack_120 = (code *)0x1c686a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_120 = (code *)0x1c6874;
    uv_run(unaff_RBX,0);
    local_110 = 0;
    pcStack_120 = (code *)0x1c6882;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1c688a;
    iVar1 = uv_loop_close(uVar2);
    local_108 = (long)iVar1;
    if (local_110 == local_108) {
      pcStack_120 = (code *)0x1c68a2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1c68bc;
    run_test_tcp_bind_error_inval_cold_1();
LAB_001c68bc:
    pcStack_120 = (code *)0x1c68cb;
    run_test_tcp_bind_error_inval_cold_2();
LAB_001c68cb:
    pcStack_120 = (code *)0x1c68da;
    run_test_tcp_bind_error_inval_cold_3();
LAB_001c68da:
    pcStack_120 = (code *)0x1c68e9;
    run_test_tcp_bind_error_inval_cold_4();
LAB_001c68e9:
    pcStack_120 = (code *)0x1c68f8;
    run_test_tcp_bind_error_inval_cold_5();
LAB_001c68f8:
    pcStack_120 = (code *)0x1c6907;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_120 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_228 = (code *)0x1c6934;
  pcStack_120 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_208);
  alStack_1f8[0] = (long)iVar1;
  lStack_218 = 0;
  if (alStack_1f8[0] == 0) {
    pcStack_228 = (code *)0x1c6959;
    uVar2 = uv_default_loop();
    pcStack_228 = (code *)0x1c6966;
    iVar1 = uv_tcp_init(uVar2,alStack_1f8);
    lStack_218 = (long)iVar1;
    lStack_210 = 0;
    if (lStack_218 != 0) goto LAB_001c6a1e;
    pcStack_228 = (code *)0x1c6997;
    iVar1 = uv_tcp_bind(alStack_1f8,auStack_208,0);
    lStack_218 = (long)iVar1;
    lStack_210 = 0;
    if (lStack_218 != 0) goto LAB_001c6a2d;
    pcStack_228 = (code *)0x1c69b8;
    unaff_RBX = uv_default_loop();
    pcStack_228 = (code *)0x1c69cc;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_228 = (code *)0x1c69d6;
    uv_run(unaff_RBX,0);
    lStack_218 = 0;
    pcStack_228 = (code *)0x1c69e4;
    uVar2 = uv_default_loop();
    pcStack_228 = (code *)0x1c69ec;
    iVar1 = uv_loop_close(uVar2);
    lStack_210 = (long)iVar1;
    if (lStack_218 == lStack_210) {
      pcStack_228 = (code *)0x1c6a04;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_228 = (code *)0x1c6a1e;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001c6a1e:
    pcStack_228 = (code *)0x1c6a2d;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001c6a2d:
    pcStack_228 = (code *)0x1c6a3c;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_228 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_330 = (code *)0x1c6a69;
  pcStack_228 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_310);
  alStack_300[0] = (long)iVar1;
  lStack_320 = 0;
  if (alStack_300[0] == 0) {
    pcStack_330 = (code *)0x1c6a8e;
    uVar2 = uv_default_loop();
    pcStack_330 = (code *)0x1c6a9b;
    iVar1 = uv_tcp_init(uVar2,alStack_300);
    lStack_320 = (long)iVar1;
    lStack_318 = 0;
    if (lStack_320 != 0) goto LAB_001c6b56;
    pcStack_330 = (code *)0x1c6acf;
    iVar1 = uv_tcp_bind(alStack_300,auStack_310,1);
    lStack_320 = (long)iVar1;
    lStack_318 = -0x16;
    if (lStack_320 != -0x16) goto LAB_001c6b65;
    pcStack_330 = (code *)0x1c6af0;
    unaff_RBX = uv_default_loop();
    pcStack_330 = (code *)0x1c6b04;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_330 = (code *)0x1c6b0e;
    uv_run(unaff_RBX,0);
    lStack_320 = 0;
    pcStack_330 = (code *)0x1c6b1c;
    uVar2 = uv_default_loop();
    pcStack_330 = (code *)0x1c6b24;
    iVar1 = uv_loop_close(uVar2);
    lStack_318 = (long)iVar1;
    if (lStack_320 == lStack_318) {
      pcStack_330 = (code *)0x1c6b3c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_330 = (code *)0x1c6b56;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001c6b56:
    pcStack_330 = (code *)0x1c6b65;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001c6b65:
    pcStack_330 = (code *)0x1c6b74;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_330 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_428 = (code *)0x1c6b90;
  pcStack_330 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_428 = (code *)0x1c6b9d;
  iVar1 = uv_tcp_init(uVar2,auStack_408);
  lStack_410 = (long)iVar1;
  lStack_418 = 0;
  if (lStack_410 == 0) {
    pcStack_428 = (code *)0x1c6bce;
    iVar1 = uv_listen(auStack_408,0x80,0);
    lStack_410 = (long)iVar1;
    lStack_418 = 0;
    if (lStack_410 != 0) goto LAB_001c6c55;
    pcStack_428 = (code *)0x1c6bef;
    unaff_RBX = uv_default_loop();
    pcStack_428 = (code *)0x1c6c03;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_428 = (code *)0x1c6c0d;
    uv_run(unaff_RBX,0);
    lStack_410 = 0;
    pcStack_428 = (code *)0x1c6c1b;
    uVar2 = uv_default_loop();
    pcStack_428 = (code *)0x1c6c23;
    iVar1 = uv_loop_close(uVar2);
    lStack_418 = (long)iVar1;
    if (lStack_410 == lStack_418) {
      pcStack_428 = (code *)0x1c6c3b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_428 = (code *)0x1c6c55;
    run_test_tcp_listen_without_bind_cold_1();
LAB_001c6c55:
    pcStack_428 = (code *)0x1c6c64;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_428 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcStack_660 = (code *)0x1c6c91;
  pcStack_428 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_5e8);
  alStack_500[0] = (long)iVar1;
  alStack_5d8[0] = 0;
  if (alStack_500[0] == 0) {
    pcStack_660 = (code *)0x1c6cc2;
    uVar2 = uv_default_loop();
    pcStack_660 = (code *)0x1c6cd2;
    iVar1 = uv_tcp_init(uVar2,alStack_500);
    alStack_5d8[0] = (long)iVar1;
    alStack_640[0] = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c6f5a;
    pcStack_660 = (code *)0x1c6d0c;
    iVar1 = uv_tcp_bind(alStack_500,auStack_5e8,0);
    alStack_5d8[0] = (long)iVar1;
    alStack_640[0] = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c6f6c;
    pcStack_660 = (code *)0x1c6d46;
    iVar1 = uv_listen(alStack_500,0x80,0);
    alStack_5d8[0] = (long)iVar1;
    alStack_640[0] = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c6f7e;
    pcStack_660 = (code *)0x1c6d79;
    iVar1 = uv_is_writable(alStack_500);
    alStack_5d8[0] = (long)iVar1;
    alStack_640[0] = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c6f90;
    pcStack_660 = (code *)0x1c6dac;
    iVar1 = uv_is_readable(alStack_500);
    alStack_5d8[0] = (long)iVar1;
    alStack_640[0] = 0;
    if (alStack_5d8[0] != 0) goto LAB_001c6fa2;
    pcStack_660 = (code *)0x1c6de3;
    auStack_510 = uv_buf_init("PING",4);
    pcStack_660 = (code *)0x1c6e12;
    iVar1 = uv_write(alStack_5d8,alStack_500,auStack_510,1,0);
    alStack_640[0] = (long)iVar1;
    lStack_650 = -0x20;
    if (alStack_640[0] != -0x20) goto LAB_001c6fb4;
    pcStack_660 = (code *)0x1c6e46;
    iVar1 = uv_shutdown(alStack_640,alStack_500,0);
    lStack_650 = (long)iVar1;
    lStack_648 = -0x6b;
    if (lStack_650 != -0x6b) goto LAB_001c6fc3;
    pcStack_660 = (code *)0x1c6e7d;
    iVar1 = uv_read_start(alStack_500,abort);
    lStack_650 = (long)iVar1;
    lStack_648 = -0x6b;
    if (lStack_650 != -0x6b) goto LAB_001c6fd2;
    pcStack_660 = (code *)0x1c6eb1;
    uv_close(alStack_500,close_cb);
    pcStack_660 = (code *)0x1c6eb6;
    uVar2 = uv_default_loop();
    pcStack_660 = (code *)0x1c6ec0;
    uv_run(uVar2,0);
    lStack_650 = 1;
    lStack_648 = (long)close_cb_called;
    if (lStack_648 != 1) goto LAB_001c6fe1;
    pcStack_660 = (code *)0x1c6eea;
    unaff_RBX = uv_default_loop();
    pcStack_660 = (code *)0x1c6efe;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_660 = (code *)0x1c6f08;
    uv_run(unaff_RBX,0);
    lStack_650 = 0;
    pcStack_660 = (code *)0x1c6f16;
    uVar2 = uv_default_loop();
    pcStack_660 = (code *)0x1c6f1e;
    iVar1 = uv_loop_close(uVar2);
    lStack_648 = (long)iVar1;
    if (lStack_650 == lStack_648) {
      pcStack_660 = (code *)0x1c6f3a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_660 = (code *)0x1c6f5a;
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001c6f5a:
    pcStack_660 = (code *)0x1c6f6c;
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001c6f6c:
    pcStack_660 = (code *)0x1c6f7e;
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001c6f7e:
    pcStack_660 = (code *)0x1c6f90;
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001c6f90:
    pcStack_660 = (code *)0x1c6fa2;
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001c6fa2:
    pcStack_660 = (code *)0x1c6fb4;
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001c6fb4:
    pcStack_660 = (code *)0x1c6fc3;
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001c6fc3:
    pcStack_660 = (code *)0x1c6fd2;
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001c6fd2:
    pcStack_660 = (code *)0x1c6fe1;
    run_test_tcp_bind_writable_flags_cold_9();
LAB_001c6fe1:
    pcStack_660 = (code *)0x1c6ff0;
    run_test_tcp_bind_writable_flags_cold_10();
  }
  pcStack_660 = run_test_tcp_bind_or_listen_error_after_close;
  run_test_tcp_bind_writable_flags_cold_11();
  alStack_758[2] = 0;
  alStack_758[1] = 0xf270002;
  pcStack_660 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_738);
  alStack_758[0] = (long)iVar1;
  if (alStack_758[0] == 0) {
    uv_close(auStack_738,0);
    iVar1 = uv_tcp_bind(auStack_738,alStack_758 + 1,0);
    alStack_758[0] = (long)iVar1;
    if (alStack_758[0] != -0x16) goto LAB_001c7146;
    iVar1 = uv_listen(auStack_738,5,0);
    alStack_758[0] = (long)iVar1;
    if (alStack_758[0] != -0x16) goto LAB_001c7153;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    alStack_758[0] = (long)iVar1;
    if (alStack_758[0] == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      alStack_758[0] = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (alStack_758[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c716d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c7146:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c7153:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c716d:
  plVar3 = alStack_758;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}